

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O0

Int128 * __thiscall clickhouse::ColumnDecimal::At(ColumnDecimal *this,size_t i)

{
  Code CVar1;
  element_type *peVar2;
  int *piVar3;
  long *plVar4;
  int128 *piVar5;
  Column *in_stack_ffffffffffffff18;
  ColumnVector<int> *in_stack_ffffffffffffff20;
  ColumnVector<absl::int128> *this_00;
  Column *in_stack_ffffffffffffff38;
  ColumnVector<absl::int128> local_88;
  Int128 *local_18;
  undefined8 local_10;
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1f47ad);
  Column::Type(in_stack_ffffffffffffff18);
  peVar2 = std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f47cc);
  CVar1 = Type::GetCode(peVar2);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x1f47e7);
  if (CVar1 == Int32) {
    std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f4802);
    Column::As<clickhouse::ColumnVector<int>>(in_stack_ffffffffffffff38);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnVector<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f4821);
    piVar3 = ColumnVector<int>::At(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
    absl::int128::int128((int128 *)&local_18,*piVar3);
    std::shared_ptr<clickhouse::ColumnVector<int>_>::~shared_ptr
              ((shared_ptr<clickhouse::ColumnVector<int>_> *)0x1f485b);
  }
  else {
    std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f48ba);
    Column::Type(in_stack_ffffffffffffff18);
    peVar2 = std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f48d9);
    CVar1 = Type::GetCode(peVar2);
    std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x1f48f4);
    if (CVar1 == Int64) {
      std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f490f);
      Column::As<clickhouse::ColumnVector<long>>(in_stack_ffffffffffffff38);
      std::
      __shared_ptr_access<clickhouse::ColumnVector<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<clickhouse::ColumnVector<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1f492b);
      plVar4 = ColumnVector<long>::At
                         ((ColumnVector<long> *)in_stack_ffffffffffffff20,
                          (size_t)in_stack_ffffffffffffff18);
      absl::int128::int128((int128 *)&local_18,*plVar4);
      std::shared_ptr<clickhouse::ColumnVector<long>_>::~shared_ptr
                ((shared_ptr<clickhouse::ColumnVector<long>_> *)0x1f4963);
    }
    else {
      std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f49bf);
      this_00 = &local_88;
      Column::As<clickhouse::ColumnVector<absl::int128>>(in_stack_ffffffffffffff38);
      std::
      __shared_ptr_access<clickhouse::ColumnVector<absl::int128>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<clickhouse::ColumnVector<absl::int128>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1f49db);
      piVar5 = ColumnVector<absl::int128>::At(this_00,(size_t)in_stack_ffffffffffffff18);
      local_18 = *(Int128 **)&piVar5->v_;
      local_10 = *(undefined8 *)((long)&piVar5->v_ + 8);
      std::shared_ptr<clickhouse::ColumnVector<absl::int128>_>::~shared_ptr
                ((shared_ptr<clickhouse::ColumnVector<absl::int128>_> *)0x1f4a18);
    }
  }
  return local_18;
}

Assistant:

Int128 ColumnDecimal::At(size_t i) const {
    if (data_->Type()->GetCode() == Type::Int32) {
        return static_cast<Int128>(data_->As<ColumnInt32>()->At(i));
    } else if (data_->Type()->GetCode() == Type::Int64) {
        return static_cast<Int128>(data_->As<ColumnInt64>()->At(i));
    } else {
        return data_->As<ColumnInt128>()->At(i);
    }
}